

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.h
# Opt level: O1

node<NULLC::Range> * __thiscall
TypedObjectPool<detail::node<NULLC::Range>,_1024>::Allocate
          (TypedObjectPool<detail::node<NULLC::Range>,_1024> *this)

{
  uint uVar1;
  MyLargeBlock *pMVar2;
  MySmallBlock *pMVar3;
  
  pMVar3 = this->freeBlocks;
  if (pMVar3 == (MySmallBlock *)0x0) {
    if (this->lastNum == 0x400) {
      pMVar2 = (MyLargeBlock *)(*(code *)NULLC::alloc)(0xa008);
      pMVar2->next = this->activePages;
      this->activePages = pMVar2;
      this->lastNum = 0;
    }
    uVar1 = this->lastNum;
    this->lastNum = uVar1 + 1;
    pMVar3 = this->activePages->page + uVar1;
  }
  else {
    this->freeBlocks = pMVar3->next;
  }
  *(node<NULLC::Range> **)(pMVar3->data + 0x10) = (node<NULLC::Range> *)0x0;
  *(node<NULLC::Range> **)(pMVar3->data + 0x18) = (node<NULLC::Range> *)0x0;
  pMVar3->next = (SmallBlock<detail::node<NULLC::Range>_> *)0x0;
  *(void **)((long)pMVar3 + 8) = (void *)0x0;
  *(int *)(pMVar3->data + 0x20) = 1;
  return (node<NULLC::Range> *)pMVar3;
}

Assistant:

T* Allocate()
	{
		MySmallBlock *result;
		if(freeBlocks)
		{
			result = freeBlocks;
			freeBlocks = freeBlocks->next;
		}else{
			if(lastNum == countInBlock)
			{
				MyLargeBlock *newPage = new(NULLC::alloc(sizeof(MyLargeBlock))) MyLargeBlock;
				newPage->next = activePages;
				activePages = newPage;
				lastNum = 0;
			}
			result = &activePages->page[lastNum++];
		}
		return new(result) T;
	}